

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_3_params(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->ss = G->val[-2];
  return;
}

Assistant:

YY_ACTION(void) yy_3_params(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v1 G->val[-1]
#define v G->val[-2]
  yyprintf((stderr, "do yy_3_params"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy=v; }\n"));
  yy=v; ;
#undef v1
#undef v
}